

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

var __thiscall cs::try_move(cs *this,var *val)

{
  proxy *ppVar1;
  
  cs_impl::any::try_move(val);
  ppVar1 = val->mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  *(proxy **)this = ppVar1;
  return (var)(proxy *)this;
}

Assistant:

var try_move(const var &val)
	{
		val.try_move();
		return val;
	}